

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.c
# Opt level: O1

int lws_hdr_custom_length(lws *wsi,char *name,int nlen)

{
  allocated_headers *paVar1;
  char *pcVar2;
  uint16_t uVar3;
  int iVar4;
  ah_data_idx_t aVar5;
  
  paVar1 = (wsi->http).ah;
  if (((paVar1 != (allocated_headers *)0x0) && ((wsi->field_0x2dc & 2) == 0)) &&
     (aVar5 = paVar1->unk_ll_head, aVar5 != 0)) {
    do {
      paVar1 = (wsi->http).ah;
      if (paVar1->data_length <= aVar5) {
        return -1;
      }
      uVar3 = lws_ser_ru16be((uint8_t *)(paVar1->data + aVar5));
      if ((uint)uVar3 == nlen) {
        pcVar2 = ((wsi->http).ah)->data;
        iVar4 = strncmp(name,pcVar2 + (aVar5 + 8),(ulong)(uint)nlen);
        if (iVar4 == 0) {
          uVar3 = lws_ser_ru16be((uint8_t *)(pcVar2 + (aVar5 + 2)));
          return (uint)uVar3;
        }
      }
      aVar5 = lws_ser_ru32be((uint8_t *)(((wsi->http).ah)->data + (aVar5 + 4)));
    } while (aVar5 != 0);
  }
  return -1;
}

Assistant:

int
lws_hdr_custom_length(struct lws *wsi, const char *name, int nlen)
{
	ah_data_idx_t ll;

	if (!wsi->http.ah || wsi->mux_substream)
		return -1;

	ll = wsi->http.ah->unk_ll_head;
	while (ll) {
		if (ll >= wsi->http.ah->data_length)
			return -1;
		if (nlen == lws_ser_ru16be(
			(uint8_t *)&wsi->http.ah->data[ll + UHO_NLEN]) &&
		    !strncmp(name, &wsi->http.ah->data[ll + UHO_NAME], nlen))
			return lws_ser_ru16be(
				(uint8_t *)&wsi->http.ah->data[ll + UHO_VLEN]);

		ll = lws_ser_ru32be((uint8_t *)&wsi->http.ah->data[ll + UHO_LL]);
	}

	return -1;
}